

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathContextSetCache(xmlXPathContextPtr ctxt,int active,int value,int options)

{
  xmlXPathContextCachePtr cache;
  void *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  
  iVar3 = -1;
  if (ctxt != (xmlXPathContextPtr)0x0) {
    cache = (xmlXPathContextCachePtr)ctxt->cache;
    if (active == 0) {
      iVar3 = 0;
      if (cache != (xmlXPathContextCachePtr)0x0) {
        xmlXPathFreeCache(cache);
        ctxt->cache = (void *)0x0;
      }
    }
    else {
      if (cache == (xmlXPathContextCachePtr)0x0) {
        puVar2 = (undefined8 *)(*xmlMalloc)(0x40);
        if (puVar2 == (undefined8 *)0x0) {
          puVar2 = (undefined8 *)0x0;
          xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating object cache\n");
        }
        else {
          puVar2[4] = 0;
          puVar2[5] = 0;
          puVar2[6] = 0;
          puVar2[7] = 0;
          puVar2[2] = 0;
          puVar2[3] = 0;
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2[5] = 0x6400000064;
          puVar2[6] = 0x6400000064;
          *(undefined4 *)(puVar2 + 7) = 100;
        }
        ctxt->cache = puVar2;
        if (puVar2 == (undefined8 *)0x0) {
          return -1;
        }
      }
      iVar3 = 0;
      if (options == 0) {
        pvVar1 = ctxt->cache;
        iVar3 = 100;
        if (-1 < value) {
          iVar3 = value;
        }
        *(int *)((long)pvVar1 + 0x28) = iVar3;
        *(int *)((long)pvVar1 + 0x2c) = iVar3;
        *(int *)((long)pvVar1 + 0x34) = iVar3;
        *(int *)((long)pvVar1 + 0x30) = iVar3;
        *(int *)((long)pvVar1 + 0x38) = iVar3;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlXPathContextSetCache(xmlXPathContextPtr ctxt,
			int active,
			int value,
			int options)
{
    if (ctxt == NULL)
	return(-1);
    if (active) {
	xmlXPathContextCachePtr cache;

	if (ctxt->cache == NULL) {
	    ctxt->cache = xmlXPathNewCache();
	    if (ctxt->cache == NULL)
		return(-1);
	}
	cache = (xmlXPathContextCachePtr) ctxt->cache;
	if (options == 0) {
	    if (value < 0)
		value = 100;
	    cache->maxNodeset = value;
	    cache->maxString = value;
	    cache->maxNumber = value;
	    cache->maxBoolean = value;
	    cache->maxMisc = value;
	}
    } else if (ctxt->cache != NULL) {
	xmlXPathFreeCache((xmlXPathContextCachePtr) ctxt->cache);
	ctxt->cache = NULL;
    }
    return(0);
}